

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O3

Slice __thiscall leveldb::anon_unknown_0::MergingIterator::key(MergingIterator *this)

{
  int iVar1;
  
  iVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar1 == '\0') {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/merger.cc"
                  ,0x6f,"virtual Slice leveldb::(anonymous namespace)::MergingIterator::key() const"
                 );
  }
  if (this->current_->valid_ != false) {
    return this->current_->key_;
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./table/iterator_wrapper.h"
                ,0x27,"Slice leveldb::IteratorWrapper::key() const");
}

Assistant:

Slice key() const override {
    assert(Valid());
    return current_->key();
  }